

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O1

void try_send_ssh_to_socket(void *ctx)

{
  bufchain *ch;
  size_t sVar1;
  ptrlen pVar2;
  
  if (*(char *)((long)ctx + 0x2058) == '\0') {
    ch = (bufchain *)((long)ctx + 0x2060);
    while( true ) {
      sVar1 = bufchain_size(ch);
      if (sVar1 == 0) break;
      pVar2 = bufchain_prefix(ch);
      (**(code **)(**(long **)((long)ctx + 0x2050) + 0x10))
                (*(long **)((long)ctx + 0x2050),0,pVar2.ptr,pVar2.len);
      bufchain_consume(ch,pVar2.len);
    }
    if ((*(char *)((long)ctx + 0x2088) == '\x01') && (*(char *)((long)ctx + 0x2089) == '\0')) {
      *(undefined1 *)((long)ctx + 0x2089) = 1;
      (**(code **)(**(long **)((long)ctx + 0x2050) + 8))(*(long **)((long)ctx + 0x2050),0,0);
      return;
    }
  }
  return;
}

Assistant:

static void try_send_ssh_to_socket(void *ctx)
{
    SshProxy *sp = (SshProxy *)ctx;

    if (sp->frozen)
        return;

    while (bufchain_size(&sp->ssh_to_socket)) {
        ptrlen pl = bufchain_prefix(&sp->ssh_to_socket);
        plug_receive(sp->plug, 0, pl.ptr, pl.len);
        bufchain_consume(&sp->ssh_to_socket, pl.len);
    }

    if (sp->rcvd_eof_ssh_to_socket &&
        !sp->sent_eof_ssh_to_socket) {
        sp->sent_eof_ssh_to_socket = true;
        plug_closing_normal(sp->plug);
    }
}